

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O0

void __thiscall flow::IRHandler::erase(IRHandler *this,BasicBlock *bb)

{
  FILE *__stream;
  bool bVar1;
  undefined8 uVar2;
  reference this_00;
  pointer __filename;
  const_iterator local_c0;
  undefined1 local_b8 [16];
  TerminateInstr *terminator;
  Instr *instr;
  iterator __end1;
  iterator __begin1;
  UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  *__range1;
  allocator<char> local_61;
  string local_60 [32];
  _Self local_40;
  BasicBlock **local_38;
  _List_node_base *local_30;
  _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
  local_28;
  _Self local_20;
  _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_> i;
  BasicBlock *bb_local;
  IRHandler *this_local;
  
  i._M_node = (_List_node_base *)bb;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
       ::begin(&this->blocks_);
  local_30 = (_List_node_base *)
             std::__cxx11::
             list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
             ::end(&this->blocks_);
  local_38 = (BasicBlock **)&i;
  local_20._M_node =
       (_List_node_base *)
       std::
       find_if<std::_List_iterator<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>,flow::IRHandler::erase(flow::BasicBlock*)::__0>
                 (local_28,(_List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
                            )local_30,(anon_class_8_1_3fcf64fe_for__M_pred)local_38);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
       ::end(&this->blocks_);
  bVar1 = std::operator!=(&local_20,&local_40);
  __stream = _stderr;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    ___begin1 = BasicBlock::instructions((BasicBlock *)i._M_node);
    __end1 = util::
             UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
             ::begin((UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                      *)&__begin1);
    instr = (Instr *)util::
                     UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                     ::end((UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                            *)&__begin1);
    while( true ) {
      bVar1 = util::
              UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
              ::iterator::operator!=(&__end1,(iterator *)&instr);
      if (!bVar1) break;
      terminator = (TerminateInstr *)
                   util::
                   UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                   ::iterator::operator*(&__end1);
      Instr::clearOperands((Instr *)terminator);
      util::
      UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
      ::iterator::operator++(&__end1);
    }
    local_b8._8_8_ = BasicBlock::getTerminator((BasicBlock *)i._M_node);
    if ((TerminateInstr *)local_b8._8_8_ != (TerminateInstr *)0x0) {
      this_00 = std::
                _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
                ::operator*(&local_20);
      __filename = std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>::
                   operator->(this_00);
      BasicBlock::remove((BasicBlock *)local_b8,(char *)__filename);
      std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr
                ((unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)local_b8);
    }
    std::
    _List_const_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
    ::_List_const_iterator(&local_c0,&local_20);
    std::__cxx11::
    list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
    ::erase(&this->blocks_,local_c0);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"Given basic block must be a member of this handler to be removed.",&local_61)
  ;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s\n",uVar2);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  abort();
}

Assistant:

void IRHandler::erase(BasicBlock* bb) {
  auto i = std::find_if(blocks_.begin(), blocks_.end(),
                        [&](const auto& obj) { return obj.get() == bb; });
  FLOW_ASSERT(i != blocks_.end(),
              "Given basic block must be a member of this handler to be removed.");

  for (Instr* instr : bb->instructions()) {
    instr->clearOperands();
  }

  if (TerminateInstr* terminator = bb->getTerminator()) {
    (*i)->remove(terminator);
  }

  blocks_.erase(i);
}